

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimizer.cpp
# Opt level: O1

PassToken __thiscall
spvtools::CreateAggressiveDCEPass(spvtools *this,bool preserve_interface,bool remove_outputs)

{
  AggressiveDCEPass *this_00;
  undefined8 *puVar1;
  
  this_00 = (AggressiveDCEPass *)operator_new(0x210);
  opt::AggressiveDCEPass::AggressiveDCEPass(this_00,preserve_interface,remove_outputs);
  puVar1 = (undefined8 *)operator_new(8);
  *puVar1 = this_00;
  *(undefined8 **)this = puVar1;
  return (unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
          )(unique_ptr<spvtools::Optimizer::PassToken::Impl,_std::default_delete<spvtools::Optimizer::PassToken::Impl>_>
            )this;
}

Assistant:

Optimizer::PassToken CreateAggressiveDCEPass(bool preserve_interface,
                                             bool remove_outputs) {
  return MakeUnique<Optimizer::PassToken::Impl>(
      MakeUnique<opt::AggressiveDCEPass>(preserve_interface, remove_outputs));
}